

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

void __thiscall
llvm::yaml::Node::Node
          (Node *this,uint Type,
          unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *D,
          StringRef A,StringRef T)

{
  SMLoc St;
  Token *pTVar1;
  SMRange local_20;
  
  this->_vptr_Node = (_func_int **)&PTR_anchor_0022e528;
  this->Doc = D;
  (this->SourceRange).Start.Ptr = (char *)0x0;
  (this->SourceRange).End.Ptr = (char *)0x0;
  this->TypeID = Type;
  (this->Anchor).Data = A.Data;
  (this->Anchor).Length = A.Length;
  (this->Tag).Data = T.Data;
  (this->Tag).Length = T.Length;
  pTVar1 = peekNext(this);
  St.Ptr = (pTVar1->Range).Data;
  SMRange::SMRange(&local_20,St,St);
  (this->SourceRange).Start.Ptr = local_20.Start.Ptr;
  (this->SourceRange).End.Ptr = local_20.End.Ptr;
  return;
}

Assistant:

Node::Node(unsigned int Type, std::unique_ptr<Document> &D, StringRef A,
           StringRef T)
    : Doc(D), TypeID(Type), Anchor(A), Tag(T) {
  SMLoc Start = SMLoc::getFromPointer(peekNext().Range.begin());
  SourceRange = SMRange(Start, Start);
}